

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pruned_spherical_quadrature.hpp
# Opt level: O3

void __thiscall
IntegratorXX::RadialGridPartition<IntegratorXX::LebedevLaikov<double>>::
RadialGridPartition<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,unsigned_long,IntegratorXX::LebedevLaikov<double>&,unsigned_long,IntegratorXX::LebedevLaikov<double>&,unsigned_long,IntegratorXX::LebedevLaikov<double>&>
          (RadialGridPartition<IntegratorXX::LebedevLaikov<double>> *this,
          RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>
          *rq,size_t idx,Quadrature<IntegratorXX::LebedevLaikov<double>_> *q,unsigned_long *args,
          LebedevLaikov<double> *args_1,unsigned_long *args_2,LebedevLaikov<double> *args_3,
          unsigned_long *args_4,LebedevLaikov<double> *args_5)

{
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  add_quads<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,unsigned_long,IntegratorXX::LebedevLaikov<double>&,unsigned_long,IntegratorXX::LebedevLaikov<double>&,unsigned_long,IntegratorXX::LebedevLaikov<double>&>
            (this,rq,idx,q,args,args_1,args_2,args_3,args_4,args_5);
  return;
}

Assistant:

RadialGridPartition( const RadialQuad& rq, size_t idx, 
                       const Quadrature<AngularQuad>& q, Args&&... args ) {
    add_quads( rq, idx, q, std::forward<Args>(args)... );
  }